

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::BitTrie::insert<slang::PoolAllocator<slang::ast::BitTrie,72ul,8ul>>
          (BitTrie *this,UdpEntrySyntax *syntax,span<const_char,_18446744073709551615UL> inputs,
          char stateChar,PoolAllocator<slang::ast::BitTrie,_72UL,_8UL> *allocator,
          SmallVector<const_slang::syntax::UdpEntrySyntax_*,_5UL> *results)

{
  span<const_char,_18446744073709551615UL> inputs_00;
  iterator ppBVar1;
  undefined8 in_RCX;
  anon_class_16_2_af07dd90 *in_RDX;
  UdpEntrySyntax *in_RSI;
  UdpEntrySyntax **in_RDI;
  BitTrie *node;
  iterator __end3;
  iterator __begin3;
  SmallVector<slang::ast::BitTrie_*,_5UL> *__range3;
  SmallVector<slang::ast::BitTrie_*,_5UL> nodes;
  anon_class_16_2_af07dd90 handle;
  BitTrie *primaryNode;
  SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*> *this_00;
  iterator local_c8;
  SmallVector<slang::ast::BitTrie_*,_5UL> *in_stack_ffffffffffffff58;
  BitTrie *in_stack_ffffffffffffff60;
  pointer in_stack_ffffffffffffff68;
  __extent_storage<18446744073709551615UL> _Var2;
  SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*> local_88 [2];
  UdpEntrySyntax ***local_48;
  UdpEntrySyntax **local_38 [3];
  UdpEntrySyntax *local_20;
  anon_class_16_2_af07dd90 *local_10;
  char cStack_1;
  
  cStack_1 = (char)((ulong)in_RCX >> 0x38);
  local_48 = local_38;
  this_00 = local_88;
  local_38[0] = in_RDI;
  local_20 = in_RSI;
  local_10 = in_RDX;
  SmallVector<slang::ast::BitTrie_*,_5UL>::SmallVector
            ((SmallVector<slang::ast::BitTrie_*,_5UL> *)0x3b2e44);
  _Var2._M_extent_value = (size_t)in_RDI;
  SmallVectorBase<slang::ast::BitTrie_*>::push_back
            ((SmallVectorBase<slang::ast::BitTrie_*> *)this_00,(BitTrie **)in_RDI);
  inputs_00._M_extent._M_extent_value = _Var2._M_extent_value;
  inputs_00._M_ptr = in_stack_ffffffffffffff68;
  traverse<slang::ast::BitTrie,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_symbols_MemberSymbols_cpp:792:23)_&>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,inputs_00,cStack_1,local_10);
  local_c8 = SmallVectorBase<slang::ast::BitTrie_*>::begin
                       ((SmallVectorBase<slang::ast::BitTrie_*> *)local_88);
  ppBVar1 = SmallVectorBase<slang::ast::BitTrie_*>::end
                      ((SmallVectorBase<slang::ast::BitTrie_*> *)local_88);
  for (; local_c8 != ppBVar1; local_c8 = local_c8 + 1) {
    if ((*local_c8)->entry != (UdpEntrySyntax *)0x0) {
      SmallVectorBase<const_slang::syntax::UdpEntrySyntax_*>::push_back(this_00,in_RDI);
    }
  }
  local_38[0][8] = local_20;
  SmallVector<slang::ast::BitTrie_*,_5UL>::~SmallVector
            ((SmallVector<slang::ast::BitTrie_*,_5UL> *)0x3b2f47);
  return;
}

Assistant:

void insert(const UdpEntrySyntax& syntax, std::span<const char> inputs, char stateChar,
                TAllocator& allocator, SmallVector<const UdpEntrySyntax*>& results) {
        BitTrie* primaryNode = this;
        auto handle = [&primaryNode, &allocator](const BitTrie& constNode,
                                                 SmallVector<BitTrie*>& nextNodes, int index,
                                                 bool primary) {
            // If we are handling a primary and the current node is also
            // the primary node we should allocate if missing, otherwise
            // we only add if it already exists.
            BitTrie& node = const_cast<BitTrie&>(constNode);
            if (primary && primaryNode == &node) {
                if (!node.children[index])
                    node.children[index] = allocator.emplace();
                primaryNode = node.children[index];
            }

            if (node.children[index])
                nextNodes.push_back(node.children[index]);
        };

        SmallVector<BitTrie*> nodes;
        nodes.push_back(this);
        traverse(nodes, inputs, stateChar, handle);

        for (auto node : nodes) {
            if (node->entry)
                results.push_back(node->entry);
        }

        // Store the provided row so as not to miss info in case of possible overlap.
        // If the primary->entry already has a value, then rewriting will not spoil
        // anything, since the rewriting will be to the equivalent grammar.
        primaryNode->entry = &syntax;
    }